

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O3

bool __thiscall
netbase_tests::TestSplitHost
          (netbase_tests *this,string *test,string *host,uint16_t port,bool validPort)

{
  uint16_t uVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  string_view in;
  uint16_t portOut;
  string hostOut;
  uint16_t local_5a;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_5a = 0;
  in._M_str = (char *)this;
  in._M_len = (size_t)test;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar3 = SplitHostPort(in,&local_5a,&local_58);
  _Var2._M_p = local_58._M_dataplus._M_p;
  if (local_58._M_string_length == host->_M_string_length) {
    if (local_58._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar4 = bcmp(local_58._M_dataplus._M_p,(host->_M_dataplus)._M_p,local_58._M_string_length);
      bVar5 = iVar4 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  uVar1 = local_5a;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != &local_58.field_2) {
    operator_delete(_Var2._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar5 & bVar3 == validPort & uVar1 == port);
  }
  __stack_chk_fail();
}

Assistant:

bool static TestSplitHost(const std::string& test, const std::string& host, uint16_t port, bool validPort=true)
{
    std::string hostOut;
    uint16_t portOut{0};
    bool validPortOut = SplitHostPort(test, portOut, hostOut);
    return hostOut == host && portOut == port && validPortOut == validPort;
}